

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<std::array<unsigned_char,_3UL>_> *this;
  char *pcVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Color pixel_color_00;
  array<unsigned_char,_3UL> aVar6;
  uint uVar7;
  int iVar8;
  Camera *this_00;
  ObjectList *objects;
  reference pvVar9;
  ostream *poVar10;
  int local_4c0;
  int local_4bc;
  int i_1;
  int j_1;
  ofstream outfile;
  Color local_298;
  undefined1 local_280 [8];
  Ray r;
  double v;
  double u;
  undefined1 auStack_238 [4];
  int s;
  Color pixel_color;
  int i;
  int j;
  ProgressBar pb;
  undefined1 local_190 [8];
  Scene scene;
  undefined1 local_b8 [8];
  vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_> img_data;
  int image_height;
  int local_78;
  allocator local_71;
  int samples_per_pixel;
  int local_50;
  int image_width;
  allocator local_39;
  string local_38 [8];
  string scene_name;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"three_spheres",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (1 < argc) {
    std::__cxx11::string::operator=(local_38,argv[1]);
  }
  local_50 = 200;
  if (2 < argc) {
    pcVar1 = argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&samples_per_pixel,pcVar1,&local_71);
    local_50 = std::__cxx11::stoi((string *)&samples_per_pixel,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&samples_per_pixel);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  local_78 = 0x28;
  if (3 < argc) {
    pcVar1 = argv[3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&image_height,pcVar1,
               (allocator *)
               ((long)&img_data.
                       super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_78 = std::__cxx11::stoi((string *)&image_height,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&image_height);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&img_data.
                       super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  img_data.
  super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
       (uint)((double)local_50 / 1.7777777777777777);
  uVar7 = local_50 * local_50;
  this = (allocator<std::array<unsigned_char,_3UL>_> *)((long)&scene.camera_.lens_radius_ + 7);
  std::allocator<std::array<unsigned_char,_3UL>_>::allocator(this);
  std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>::
  vector((vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_> *
         )local_b8,(ulong)uVar7,this);
  std::allocator<std::array<unsigned_char,_3UL>_>::~allocator
            ((allocator<std::array<unsigned_char,_3UL>_> *)((long)&scene.camera_.lens_radius_ + 7));
  std::__cxx11::string::string((string *)(pb.bar_old + 0x40),local_38);
  create_scene((Scene *)local_190,(string *)(pb.bar_old + 0x40));
  std::__cxx11::string::~string((string *)(pb.bar_old + 0x40));
  ProgressBar::ProgressBar((ProgressBar *)&i);
  pixel_color.e[2]._4_4_ =
       (uint)img_data.
             super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  while (pixel_color.e[2]._4_4_ = pixel_color.e[2]._4_4_ - 1, -1 < (int)pixel_color.e[2]._4_4_) {
    ProgressBar::set_value
              ((ProgressBar *)&i,
               ((double)(int)(~pixel_color.e[2]._4_4_ +
                             (uint)img_data.
                                   super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage) * 100.0) /
               (double)(int)(uint)img_data.
                                  super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    for (pixel_color.e[2]._0_4_ = 0; pixel_color.e[2]._0_4_ < local_50;
        pixel_color.e[2]._0_4_ = pixel_color.e[2]._0_4_ + 1) {
      Vec3::Vec3((Vec3 *)auStack_238,0.0,0.0,0.0);
      for (u._4_4_ = 0; u._4_4_ < local_78; u._4_4_ = u._4_4_ + 1) {
        dVar2 = (double)pixel_color.e[2]._0_4_;
        dVar3 = nrand();
        iVar8 = local_50 + -1;
        dVar4 = (double)(int)pixel_color.e[2]._4_4_;
        dVar5 = nrand();
        r.dir.e[2] = (dVar4 + dVar5) /
                     (double)(int)((uint)img_data.
                                         super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage - 1);
        this_00 = Scene::camera((Scene *)local_190);
        Camera::get_ray((Ray *)local_280,this_00,(dVar2 + dVar3) / (double)iVar8,r.dir.e[2]);
        objects = Scene::objects((Scene *)local_190);
        trace_color(&local_298,(Ray *)local_280,objects);
        Vec3::operator+=((Vec3 *)auStack_238,&local_298);
      }
      pixel_color_00.e[1] = pixel_color.e[0];
      pixel_color_00.e[0] = _auStack_238;
      pixel_color_00.e[2] = pixel_color.e[1];
      aVar6 = gen_color(pixel_color_00,local_78);
      pvVar9 = std::
               vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
               ::operator[]((vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                             *)local_b8,
                            (long)(int)((((uint)img_data.
                                                super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                         1) - pixel_color.e[2]._4_4_) * local_50 +
                                       pixel_color.e[2]._0_4_));
      *(short *)pvVar9->_M_elems = aVar6._M_elems._0_2_;
      pvVar9->_M_elems[2] = aVar6._M_elems[2];
    }
  }
  std::ofstream::ofstream(&i_1);
  std::ofstream::open((char *)&i_1,0x122490);
  poVar10 = std::operator<<((ostream *)&i_1,"P6\n");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_50);
  poVar10 = std::operator<<(poVar10," ");
  poVar10 = (ostream *)
            std::ostream::operator<<
                      (poVar10,(uint)img_data.
                                     super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar10 = std::operator<<(poVar10,"\n");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,0xff);
  std::operator<<(poVar10,"\n");
  std::ofstream::close();
  std::operator|(_S_bin,_S_app);
  std::ofstream::open((char *)&i_1,0x122490);
  for (local_4bc = 0;
      local_4bc <=
      (int)((uint)img_data.
                  super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - 1); local_4bc = local_4bc + 1
      ) {
    for (local_4c0 = 0; local_4c0 < local_50; local_4c0 = local_4c0 + 1) {
      pvVar9 = std::
               vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
               ::operator[]((vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                             *)local_b8,(long)(local_4bc * local_50 + local_4c0));
      write_color((ofstream *)&i_1,(array<unsigned_char,_3UL>)*&pvVar9->_M_elems);
    }
  }
  std::operator<<((ostream *)&i_1,'\n');
  std::ofstream::close();
  teardown();
  std::ofstream::~ofstream(&i_1);
  ProgressBar::~ProgressBar((ProgressBar *)&i);
  Scene::~Scene((Scene *)local_190);
  std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>::
  ~vector((vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
           *)local_b8);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char** argv) {

  // options
  std::string scene_name = "three_spheres";

  if (argc > 1) {
    scene_name = argv[1];
  }

  int image_width = 200;


  if (argc > 2) {
    image_width = std::stoi(argv[2]);
  }

  int samples_per_pixel = 40;

  if (argc > 3) {
    samples_per_pixel = std::stoi(argv[3]);
  }

  const int image_height = static_cast<int>(image_width / ASPECT_RATIO);

  std::vector<std::array<uint8_t, 3>> img_data(image_width*image_width);

  // image generation
  Scene scene = create_scene(scene_name);
  ProgressBar pb{};

  for (int j = image_height - 1; j >= 0; --j) {
    pb.set_value(100.0 * (image_height - 1 - j) / (double)image_height);
    #pragma omp parallel for shared(img_data, scene) schedule(dynamic)
    for (int i = 0; i < image_width; ++i) {
      Color pixel_color{0.0, 0.0, 0.0};
      for (int s = 0; s < samples_per_pixel; ++s) {
        double u = (i + nrand()) / (image_width - 1);
        double v = (j + nrand()) / (image_height - 1);
        Ray r = scene.camera().get_ray(u, v);
        pixel_color += trace_color(r, scene.objects());
      }
      img_data[(image_height - 1 - j) * image_width + i] = gen_color(pixel_color, samples_per_pixel);
    }
  }

  // write image file
  std::ofstream outfile;
  outfile.open("image.ppm");

  // write ppm header
  outfile << "P6\n" << image_width << " " << image_height << "\n" << IRGB_MAX << "\n";
  outfile.close();

  outfile.open("image.ppm", std::ios::binary | std::ios::app);

  for (int j = 0; j <= image_height - 1; ++j) {
    for (int i = 0; i < image_width; ++i) {
      write_color(outfile, img_data[j * image_width + i]);
    }
  }
  outfile << '\n';
  outfile.close();


  // used to clean up openmc memory if needed
  teardown();

  return 0;
}